

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  memory_buf_t *out;
  int iVar1;
  size_t sVar2;
  long lVar3;
  undefined *__src;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  ptrdiff_t _Num_1;
  char *__s;
  ptrdiff_t _Num;
  size_t sVar9;
  uint uVar10;
  char *buf_ptr;
  char *buf_ptr_3;
  ulong uVar11;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_03;
  format_int local_58;
  long local_38;
  
  lVar3 = (msg->time).__d.__r / 1000000000;
  if (((this->cache_timestamp_).__r != lVar3) ||
     ((this->cached_datetime_).super_buffer<char>.size_ == 0)) {
    out = &this->cached_datetime_;
    (this->cached_datetime_).super_buffer<char>.size_ = 0;
    local_38 = lVar3;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ == 0) {
      (**(out->super_buffer<char>)._vptr_buffer)(out,1);
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = '[';
    iVar1 = tm_time->tm_year;
    uVar10 = iVar1 + 0x76c;
    uVar6 = -uVar10;
    if (0 < (int)uVar10) {
      uVar6 = uVar10;
    }
    pcVar7 = fmt::v6::format_int::format_decimal(&local_58,(ulong)uVar6);
    local_58.str_ = pcVar7;
    if (iVar1 < -0x76c) {
      local_58.str_ = pcVar7 + -1;
      pcVar7[-1] = '-';
    }
    pcVar7 = local_58.str_;
    sVar9 = (long)(local_58.buffer_ + 0x15) - (long)local_58.str_;
    uVar11 = (this->cached_datetime_).super_buffer<char>.size_ + sVar9;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11) {
      (**(out->super_buffer<char>)._vptr_buffer)(out,uVar11);
    }
    if (local_58.buffer_ + 0x15 != pcVar7) {
      memmove((this->cached_datetime_).super_buffer<char>.ptr_ +
              (this->cached_datetime_).super_buffer<char>.size_,pcVar7,sVar9);
    }
    (this->cached_datetime_).super_buffer<char>.size_ = uVar11;
    if ((this->cached_datetime_).super_buffer<char>.capacity_ < uVar11 + 1) {
      (**(out->super_buffer<char>)._vptr_buffer)(out,uVar11 + 1);
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = '-';
    uVar10 = tm_time->tm_mon + 1;
    if (uVar10 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (byte)((ulong)uVar10 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
    }
    else {
      format_str.size_ = 5;
      format_str.data_ = "{:02}";
      args.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&local_58;
      args.types_ = 2;
      local_58.buffer_._0_8_ = (ulong)uVar10;
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)out,format_str,args,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(out->super_buffer<char>)._vptr_buffer)();
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = '-';
    uVar10 = tm_time->tm_mday;
    uVar11 = (ulong)uVar10;
    if (uVar11 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (byte)(uVar11 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
    }
    else {
      format_str_00.size_ = 5;
      format_str_00.data_ = "{:02}";
      args_00.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&local_58;
      args_00.types_ = 2;
      local_58.buffer_._0_8_ = uVar11;
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)out,format_str_00,args_00,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(out->super_buffer<char>)._vptr_buffer)();
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = ' ';
    uVar10 = tm_time->tm_hour;
    uVar11 = (ulong)uVar10;
    if (uVar11 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (byte)(uVar11 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
    }
    else {
      format_str_01.size_ = 5;
      format_str_01.data_ = "{:02}";
      args_01.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&local_58;
      args_01.types_ = 2;
      local_58.buffer_._0_8_ = uVar11;
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)out,format_str_01,args_01,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(out->super_buffer<char>)._vptr_buffer)();
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = ':';
    uVar10 = tm_time->tm_min;
    uVar11 = (ulong)uVar10;
    if (uVar11 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (byte)(uVar11 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
    }
    else {
      format_str_02.size_ = 5;
      format_str_02.data_ = "{:02}";
      args_02.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&local_58;
      args_02.types_ = 2;
      local_58.buffer_._0_8_ = uVar11;
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)out,format_str_02,args_02,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(out->super_buffer<char>)._vptr_buffer)();
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = ':';
    uVar10 = tm_time->tm_sec;
    uVar11 = (ulong)uVar10;
    if (uVar11 < 100) {
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (byte)(uVar11 / 10) | 0x30;
      if ((this->cached_datetime_).super_buffer<char>.capacity_ <
          (this->cached_datetime_).super_buffer<char>.size_ + 1) {
        (**(out->super_buffer<char>)._vptr_buffer)();
      }
      pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
      sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
      (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
      pcVar7[sVar2] = (char)uVar10 + (char)(uVar10 / 10) * -10 | 0x30;
    }
    else {
      format_str_03.size_ = 5;
      format_str_03.data_ = "{:02}";
      args_03.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&local_58;
      args_03.types_ = 2;
      local_58.buffer_._0_8_ = uVar11;
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)out,format_str_03,args_03,(locale_ref)0x0);
    }
    if ((this->cached_datetime_).super_buffer<char>.capacity_ <
        (this->cached_datetime_).super_buffer<char>.size_ + 1) {
      (**(out->super_buffer<char>)._vptr_buffer)();
    }
    pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
    sVar2 = (this->cached_datetime_).super_buffer<char>.size_;
    (this->cached_datetime_).super_buffer<char>.size_ = sVar2 + 1;
    pcVar7[sVar2] = '.';
    (this->cache_timestamp_).__r = local_38;
  }
  pcVar7 = (this->cached_datetime_).super_buffer<char>.ptr_;
  sVar9 = (this->cached_datetime_).super_buffer<char>.size_;
  uVar11 = (dest->super_buffer<char>).size_ + sVar9;
  if ((dest->super_buffer<char>).capacity_ < uVar11) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11);
  }
  if (sVar9 != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar9);
  }
  (dest->super_buffer<char>).size_ = uVar11;
  lVar3 = (msg->time).__d.__r;
  auVar4 = SEXT816(lVar3) * SEXT816(0x112e0be826d694b3);
  auVar5 = SEXT816(lVar3) * SEXT816(0x431bde82d7b634db);
  fmt_helper::pad3<unsigned_int>
            (((int)(auVar4._8_8_ >> 0x1a) - (auVar4._12_4_ >> 0x1f)) * -1000 +
             ((int)(auVar5._8_8_ >> 0x12) - (auVar5._12_4_ >> 0x1f)),dest);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ']';
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  if ((msg->logger_name).size_ != 0) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = '[';
    pcVar7 = (msg->logger_name).data_;
    sVar9 = (msg->logger_name).size_;
    uVar11 = (dest->super_buffer<char>).size_ + sVar9;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11);
    }
    if (sVar9 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar9);
    }
    (dest->super_buffer<char>).size_ = uVar11;
    if ((dest->super_buffer<char>).capacity_ < uVar11 + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11 + 1);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ']';
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = '[';
  sVar2 = (dest->super_buffer<char>).size_;
  msg->color_range_start = sVar2;
  __src = (&level::level_string_views)[(ulong)msg->level * 2];
  sVar9 = *(size_t *)(&DAT_001b8688 + (ulong)msg->level * 0x10);
  uVar11 = sVar2 + sVar9;
  if ((dest->super_buffer<char>).capacity_ < uVar11) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11);
  }
  if (sVar9 != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,sVar9);
  }
  (dest->super_buffer<char>).size_ = uVar11;
  msg->color_range_end = uVar11;
  if ((dest->super_buffer<char>).capacity_ < uVar11 + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11 + 1);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ']';
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  if ((msg->source).line != 0) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = '[';
    pcVar7 = (msg->source).filename;
    pcVar8 = strrchr(pcVar7,0x2f);
    __s = pcVar8 + 1;
    if (pcVar8 == (char *)0x0) {
      __s = pcVar7;
    }
    sVar9 = strlen(__s);
    uVar11 = (dest->super_buffer<char>).size_ + sVar9;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11);
    }
    if (sVar9 != 0) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__s,sVar9);
    }
    (dest->super_buffer<char>).size_ = uVar11;
    if ((dest->super_buffer<char>).capacity_ < uVar11 + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11 + 1);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ':';
    uVar10 = (msg->source).line;
    uVar6 = -uVar10;
    if (0 < (int)uVar10) {
      uVar6 = uVar10;
    }
    pcVar7 = fmt::v6::format_int::format_decimal(&local_58,(ulong)uVar6);
    local_58.str_ = pcVar7;
    if ((int)uVar10 < 0) {
      local_58.str_ = pcVar7 + -1;
      pcVar7[-1] = '-';
    }
    pcVar7 = local_58.str_;
    sVar9 = (long)(local_58.buffer_ + 0x15) - (long)local_58.str_;
    uVar11 = (dest->super_buffer<char>).size_ + sVar9;
    if ((dest->super_buffer<char>).capacity_ < uVar11) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11);
    }
    if (local_58.buffer_ + 0x15 != pcVar7) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar9);
    }
    (dest->super_buffer<char>).size_ = uVar11;
    if ((dest->super_buffer<char>).capacity_ < uVar11 + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11 + 1);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ']';
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  }
  pcVar7 = (msg->payload).data_;
  sVar9 = (msg->payload).size_;
  uVar11 = (dest->super_buffer<char>).size_ + sVar9;
  if ((dest->super_buffer<char>).capacity_ < uVar11) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar11);
  }
  if (sVar9 != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar7,sVar9);
  }
  (dest->super_buffer<char>).size_ = uVar11;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0)
        {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

        // append logger name if exists
        if (msg.logger_name.size() > 0)
        {
            dest.push_back('[');
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty())
        {
            dest.push_back('[');
            const char *filename = details::short_filename_formatter<details::null_scoped_padder>::basename(msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }